

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomCommunicationParameters.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::IntercomCommunicationParameters::Decode
          (IntercomCommunicationParameters *this,KDataStream *stream)

{
  KUINT16 KVar1;
  GroupAssignmentRecord *this_00;
  KException *this_01;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 4) {
    this_01 = (KException *)__cxa_allocate_exception(0x30);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
    KException::KException(this_01,&local_40,2);
    __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
  }
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16Type);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16Length);
  if ((this->m_pRecord != (DataTypeBase *)0x0) && (this->m_bMemoryManage == true)) {
    (*this->m_pRecord->_vptr_DataTypeBase[1])();
  }
  this->m_bMemoryManage = true;
  KVar1 = this->m_ui16Type;
  if (KVar1 == 3) {
    this_00 = (GroupAssignmentRecord *)operator_new(0x28);
    KVar1 = 0x10;
    GroupAssignmentRecord::GroupAssignmentRecord(this_00,stream);
  }
  else if (KVar1 == 2) {
    this_00 = (GroupAssignmentRecord *)operator_new(0x10);
    KVar1 = 8;
    GroupDestinationRecord::GroupDestinationRecord((GroupDestinationRecord *)this_00,stream);
  }
  else {
    if (KVar1 != 1) {
      return;
    }
    this_00 = (GroupAssignmentRecord *)operator_new(0x20);
    KVar1 = 0xc;
    EntityDestinationRecord::EntityDestinationRecord((EntityDestinationRecord *)this_00,stream);
  }
  this->m_pRecord = &this_00->super_DataTypeBase;
  this->m_ui16Length = KVar1;
  return;
}

Assistant:

void IntercomCommunicationParameters::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < IntercomCommunicationParameters::INTERCOM_COMMS_PARAM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui16Type
           >> m_ui16Length;

    if( m_pRecord && m_bMemoryManage )delete m_pRecord;

    m_bMemoryManage = true;

    switch( m_ui16Type )
    {
    case EntityDestinationRecord_Type:
        m_pRecord = new EntityDestinationRecord( stream );
        m_ui16Length = EntityDestinationRecord::ENTITY_DESTINATION_RECORD_SIZE;
        break;

    case GroupDestinationRecord_Type:
        m_pRecord = new GroupDestinationRecord( stream );
        m_ui16Length = GroupDestinationRecord::GROUP_DESTINATION_RECORD_SIZE;
        break;

    case GroupAssignmentRecord_Type:
        m_pRecord = new GroupAssignmentRecord( stream );
        m_ui16Length = GroupAssignmentRecord::GROUP_ASSIGNMENT_RECORD_SIZE;
        break;
    }
}